

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O1

void __thiscall
duckdb::ReservoirSample::WeightedMerge(ReservoirSample *this,ReservoirSample *other_sample)

{
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  *this_00;
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true> *this_01;
  idx_t iVar1;
  pointer ppVar2;
  value_type vVar3;
  idx_t iVar4;
  idx_t iVar5;
  pointer pBVar6;
  pointer pRVar7;
  reference pvVar8;
  DataChunk *this_;
  DataChunk *other;
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  *this_02;
  int iVar9;
  ulong uVar10;
  vector<unsigned_long,_true> this_indexes_to_replace;
  pair<double,_unsigned_long> other_top;
  SelectionVector sel_other;
  vector<unsigned_long,_true> local_88;
  ReservoirSample *local_68;
  value_type local_60;
  pair<double,_unsigned_long> local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  double local_38;
  
  iVar4 = GetActiveSampleCount(this);
  iVar5 = GetActiveSampleCount(other_sample);
  this_00 = &(this->super_BlockingSample).base_reservoir_sample;
  pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_00);
  iVar1 = pBVar6->num_entries_seen_total;
  this_02 = &(other_sample->super_BlockingSample).base_reservoir_sample;
  local_68 = other_sample;
  pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_02);
  uVar10 = iVar1 + pBVar6->num_entries_seen_total;
  if (this->sample_count < uVar10) {
    uVar10 = this->sample_count;
  }
  local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (unsigned_long *)0x0;
  local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (unsigned_long *)0x0;
  for (; uVar10 < iVar5 + iVar4; uVar10 = uVar10 + 1) {
    pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    local_38 = pBVar6->min_weight_threshold;
    pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_02);
    if (local_38 < pBVar6->min_weight_threshold || local_38 == pBVar6->min_weight_threshold) {
      local_50 = BlockingSample::PopFromWeightQueue(&this->super_BlockingSample);
      if (local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_88,
                   (iterator)
                   local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_50.second);
      }
      else {
        *local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_50.second;
        local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
               ::operator->(this_00);
    }
    else {
      pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
               ::operator->(this_02);
      ::std::
      priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
      ::pop(&pBVar6->reservoir_weights);
      pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
               ::operator->(this_02);
    }
    ppVar2 = (pBVar6->reservoir_weights).c.
             super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (ppVar2 == (pBVar6->reservoir_weights).c.
                  super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      pBVar6->min_weight_threshold = 1.0;
    }
    else {
      pBVar6->min_weight_threshold = -ppVar2->first;
      pBVar6->min_weighted_entry_index = ppVar2->second;
    }
  }
  pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_02);
  SelectionVector::SelectionVector
            ((SelectionVector *)&local_50,
             (long)(pBVar6->reservoir_weights).c.
                   super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pBVar6->reservoir_weights).c.
                   super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  this_01 = &this->reservoir_chunk;
  uVar10 = 0;
  while (pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                  ::operator->(this_02),
        (pBVar6->reservoir_weights).c.
        super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pBVar6->reservoir_weights).c.
        super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
    local_60 = BlockingSample::PopFromWeightQueue(&local_68->super_BlockingSample);
    pRVar7 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
             operator->(this_01);
    iVar1 = (pRVar7->chunk).count;
    *(sel_t *)((long)local_50.first + uVar10 * 4) = (sel_t)local_60.second;
    iVar9 = (int)iVar1;
    if (uVar10 < (ulong)((long)local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3)) {
      pvVar8 = vector<unsigned_long,_true>::operator[](&local_88,uVar10);
      vVar3 = *pvVar8;
      (this->sel).sel_vector[vVar3] = iVar9 + (int)uVar10;
      local_60.second = vVar3;
    }
    else {
      iVar1 = this->sel_size;
      (this->sel).sel_vector[iVar1] = iVar9 + (int)uVar10;
      local_60.second = iVar1;
      this->sel_size = iVar1 + 1;
    }
    pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    ::std::
    priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
    ::push(&pBVar6->reservoir_weights,&local_60);
    uVar10 = uVar10 + 1;
  }
  pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_00);
  ppVar2 = (pBVar6->reservoir_weights).c.
           super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar2 == (pBVar6->reservoir_weights).c.
                super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar6->min_weight_threshold = 1.0;
  }
  else {
    pBVar6->min_weight_threshold = -ppVar2->first;
    pBVar6->min_weighted_entry_index = ppVar2->second;
  }
  pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_00);
  iVar1 = pBVar6->num_entries_seen_total;
  pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_02);
  iVar4 = pBVar6->num_entries_seen_total;
  pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_00);
  pBVar6->num_entries_seen_total = iVar4 + iVar1;
  this_ = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
           operator->(this_01)->chunk;
  other = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
           operator->(&local_68->reservoir_chunk)->chunk;
  UpdateSampleAppend(this,this_,other,(SelectionVector *)&local_50,uVar10);
  pRVar7 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
           operator->(this_01);
  if (0x3800 < (pRVar7->chunk).count) {
    Vacuum(this);
  }
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  if (local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ReservoirSample::WeightedMerge(ReservoirSample &other_sample) {
	D_ASSERT(GetSamplingState() == SamplingState::RESERVOIR);
	D_ASSERT(other_sample.GetSamplingState() == SamplingState::RESERVOIR);

	// Find out how many samples we want to keep.
	idx_t total_samples = GetActiveSampleCount() + other_sample.GetActiveSampleCount();
	idx_t total_samples_seen =
	    base_reservoir_sample->num_entries_seen_total + other_sample.base_reservoir_sample->num_entries_seen_total;
	idx_t num_samples_to_keep = MinValue<idx_t>(total_samples, MinValue<idx_t>(sample_count, total_samples_seen));

	D_ASSERT(GetActiveSampleCount() <= num_samples_to_keep);
	D_ASSERT(total_samples <= FIXED_SAMPLE_SIZE * 2);

	// pop from base base_reservoir weights until there are num_samples_to_keep left.
	vector<idx_t> this_indexes_to_replace;
	for (idx_t i = num_samples_to_keep; i < total_samples; i++) {
		auto min_weight_this = base_reservoir_sample->min_weight_threshold;
		auto min_weight_other = other_sample.base_reservoir_sample->min_weight_threshold;
		// min weight threshol is always positive
		if (min_weight_this > min_weight_other) {
			// pop from other
			other_sample.base_reservoir_sample->reservoir_weights.pop();
			other_sample.base_reservoir_sample->UpdateMinWeightThreshold();
		} else {
			auto top_this = PopFromWeightQueue();
			this_indexes_to_replace.push_back(top_this.second);
			base_reservoir_sample->UpdateMinWeightThreshold();
		}
	}

	D_ASSERT(other_sample.GetPriorityQueueSize() + GetPriorityQueueSize() <= FIXED_SAMPLE_SIZE);
	D_ASSERT(other_sample.GetPriorityQueueSize() + GetPriorityQueueSize() == num_samples_to_keep);
	D_ASSERT(other_sample.reservoir_chunk->chunk.GetTypes() == reservoir_chunk->chunk.GetTypes());

	// Prepare a selection vector to copy data from the other sample chunk to this sample chunk
	SelectionVector sel_other(other_sample.GetPriorityQueueSize());
	D_ASSERT(GetPriorityQueueSize() <= num_samples_to_keep);
	D_ASSERT(other_sample.GetPriorityQueueSize() >= this_indexes_to_replace.size());
	idx_t chunk_offset = 0;

	// Now push weights from other.base_reservoir_sample to this
	// Depending on how many sample values "this" has, we either need to add to the selection vector
	// Or replace values in "this'" selection vector
	idx_t i = 0;
	while (other_sample.GetPriorityQueueSize() > 0) {
		auto other_top = other_sample.PopFromWeightQueue();
		idx_t index_for_new_pair = chunk_offset + reservoir_chunk->chunk.size();

		// update the sel used to copy values from other to this
		sel_other.set_index(chunk_offset, other_top.second);
		if (i < this_indexes_to_replace.size()) {
			auto replacement_index = this_indexes_to_replace[i];
			sel.set_index(replacement_index, index_for_new_pair);
			other_top.second = replacement_index;
		} else {
			sel.set_index(sel_size, index_for_new_pair);
			other_top.second = sel_size;
			sel_size += 1;
		}

		// make sure that the sample indexes are (this.sample_chunk.size() + chunk_offfset)
		base_reservoir_sample->reservoir_weights.push(other_top);
		chunk_offset += 1;
		i += 1;
	}

	D_ASSERT(GetPriorityQueueSize() == num_samples_to_keep);

	base_reservoir_sample->UpdateMinWeightThreshold();
	D_ASSERT(base_reservoir_sample->min_weight_threshold > 0);
	base_reservoir_sample->num_entries_seen_total = GetTuplesSeen() + other_sample.GetTuplesSeen();

	UpdateSampleAppend(reservoir_chunk->chunk, other_sample.reservoir_chunk->chunk, sel_other, chunk_offset);
	if (reservoir_chunk->chunk.size() > FIXED_SAMPLE_SIZE * (FIXED_SAMPLE_SIZE_MULTIPLIER - 3)) {
		Vacuum();
	}

	Verify();
}